

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_com.c
# Opt level: O1

void hal_vp9d_update_counts(void *buf,void *dxva)

{
  long lVar1;
  int *piVar2;
  int *piVar3;
  ushort uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  int *piVar11;
  long lVar12;
  int *piVar13;
  int *piVar14;
  size_t __n;
  long lVar15;
  bool bVar16;
  long local_38;
  
  uVar4 = *(ushort *)((long)dxva + 2) & 0x81;
  __n = 0x188;
  if (uVar4 == 1) {
    __n = 0x6a8;
  }
  memcpy((void *)((long)dxva + 0x8c8),buf,__n);
  if (uVar4 != 1) {
    memset((void *)((long)dxva + 0xf70),0,0x2d00);
  }
  piVar14 = (int *)((long)buf + __n);
  lVar1 = (long)dxva + 0x2a74;
  piVar3 = (int *)((long)dxva + 0xf78);
  local_38 = 0;
  while( true ) {
    lVar7 = 0;
    piVar2 = piVar3;
    lVar6 = lVar1;
    do {
      piVar8 = piVar2;
      lVar9 = lVar6;
      lVar10 = 0;
      do {
        lVar12 = 0;
        piVar11 = piVar8;
        lVar15 = lVar9;
        do {
          lVar5 = 0;
          piVar13 = piVar11;
          do {
            *(int *)(lVar15 + -4 + lVar5 * 8) = piVar14[1];
            *(int *)(lVar15 + lVar5 * 8) = *piVar14 - piVar14[1];
            piVar13[-2] = piVar14[2];
            piVar13[-1] = piVar14[3];
            *piVar13 = piVar14[4];
            piVar14 = piVar14 + 5;
            lVar5 = lVar5 + 1;
            piVar13 = piVar13 + 3;
          } while (lVar5 != 6);
          lVar12 = lVar12 + 1;
          lVar15 = lVar15 + 0x30;
          piVar11 = piVar11 + 0x12;
        } while (lVar12 != 6);
        lVar9 = lVar9 + 0x240;
        piVar8 = piVar8 + 0xd8;
        bVar16 = lVar10 == 0;
        lVar10 = lVar10 + 1;
      } while (bVar16);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x480;
      piVar2 = piVar2 + 0x1b0;
    } while (lVar7 != 4);
    if (uVar4 != 1) break;
    lVar1 = lVar1 + 0x120;
    piVar3 = piVar3 + 0x6c;
    bVar16 = local_38 != 0;
    local_38 = local_38 + 1;
    if (bVar16) {
      return;
    }
  }
  return;
}

Assistant:

void hal_vp9d_update_counts(void *buf, void *dxva)
{
    DXVA_PicParams_VP9 *s = (DXVA_PicParams_VP9*)dxva;
    RK_S32 i, j, m, n, k;
    RK_U32 *eob_coef;
    RK_S32 ref_type;
#ifdef dump
    RK_U32 count_length;
#endif
    RK_U32 com_len = 0;

#ifdef dump
    if (!(s->frame_type == 0 || s->intra_only)) //inter
        count_length = (213 * 64 + 576 * 5 * 32) / 8;
    else //intra
        count_length = (49 * 64 + 288 * 5 * 32) / 8;

    fwrite(buf, 1, count_length, vp9_fp1);
    fflush(vp9_fp1);
#endif
    if ((s->frame_type == 0 || s->intra_only)) {
        com_len = sizeof(s->counts.partition) + sizeof(s->counts.skip) + sizeof(s->counts.intra)
                  + sizeof(s->counts.tx32p) + sizeof(s->counts.tx16p) + sizeof(s->counts.tx8p);
    } else {
        com_len = sizeof(s->counts) - sizeof(s->counts.coef) - sizeof(s->counts.eob);
    }
    eob_coef = (RK_U32 *)(buf + com_len);
    memcpy(&s->counts, buf, com_len);
    ref_type = (!(s->frame_type == 0 || s->intra_only)) ? 2 : 1;
    if (ref_type == 1) {
        memset(s->counts.eob, 0, sizeof(s->counts.eob));
        memset(s->counts.coef, 0, sizeof(s->counts.coef));
    }
    for (i = 0; i < ref_type; i++) {
        for (j = 0; j < 4; j++) {
            for (m = 0; m < 2; m++) {
                for (n = 0; n < 6; n++) {
                    for (k = 0; k < 6; k++) {
                        s->counts.eob[j][m][i][n][k][0] = eob_coef[1];
                        s->counts.eob[j][m][i][n][k][1] = eob_coef[0] - eob_coef[1]; //ffmpeg need do  branch_ct[UNCONSTRAINED_NODES][2] =  { neob, eob_counts[i][j][k][l] - neob },
                        s->counts.coef[j][m][i][n][k][0] = eob_coef[2];
                        s->counts.coef[j][m][i][n][k][1] = eob_coef[3];
                        s->counts.coef[j][m][i][n][k][2] = eob_coef[4];
                        eob_coef += 5;
                    }
                }
            }
        }
    }
}